

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXUtil.cpp
# Opt level: O0

size_t Assimp::FBX::Util::ComputeDecodedSizeBase64(char *in,size_t inLength)

{
  ulong uVar1;
  ulong uVar2;
  size_t full_length;
  size_t equals;
  size_t inLength_local;
  char *in_local;
  
  if (inLength < 2) {
    in_local = (char *)0x0;
  }
  else {
    uVar1 = (ulong)(in[inLength - 1] == '=') + (ulong)(in[inLength - 2] == '=');
    uVar2 = inLength * 3 >> 2;
    if (uVar2 < uVar1) {
      in_local = (char *)0x0;
    }
    else {
      in_local = (char *)(uVar2 - uVar1);
    }
  }
  return (size_t)in_local;
}

Assistant:

size_t ComputeDecodedSizeBase64(const char* in, size_t inLength)
{
    if (inLength < 2)
    {
        return 0;
    }
    const size_t equals = size_t(in[inLength - 1] == '=') + size_t(in[inLength - 2] == '=');
    const size_t full_length = (inLength * 3) >> 2; // div by 4
    if (full_length < equals)
    {
        return 0;
    }
    return full_length - equals;
}